

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_tostring.hpp
# Opt level: O1

string * __thiscall
Catch::Detail::
rangeToString<(anonymous_namespace)::Constructable_const*,(anonymous_namespace)::Constructable_const*>
          (string *__return_storage_ptr__,Detail *this,Constructable *first,Constructable *last)

{
  Constructable *pCVar1;
  ReusableStringStream rss;
  ReusableStringStream RStack_58;
  char *local_48;
  undefined8 local_40;
  undefined2 local_38;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined4 uStack_34;
  
  ReusableStringStream::ReusableStringStream(&RStack_58);
  std::__ostream_insert<char,std::char_traits<char>>(RStack_58.m_oss,"{ ",2);
  if ((Constructable *)this != first) {
    local_38 = 0x3f7b;
    uStack_36 = 0x7d;
    uStack_35 = 0;
    local_40 = 3;
    local_48 = (char *)&local_38;
    std::__ostream_insert<char,std::char_traits<char>>(RStack_58.m_oss,(char *)&local_38,3);
    if (local_48 != (char *)&local_38) {
      operator_delete(local_48,CONCAT44(uStack_34,CONCAT13(uStack_35,CONCAT12(uStack_36,local_38)))
                               + 1);
    }
    for (pCVar1 = (Constructable *)(this + 8); pCVar1 != first; pCVar1 = pCVar1 + 1) {
      std::__ostream_insert<char,std::char_traits<char>>(RStack_58.m_oss,", ",2);
      uStack_36 = 0x7d;
      local_38 = 0x3f7b;
      local_40 = 3;
      uStack_35 = 0;
      local_48 = (char *)&local_38;
      std::__ostream_insert<char,std::char_traits<char>>(RStack_58.m_oss,(char *)&local_38,3);
      if (local_48 != (char *)&local_38) {
        operator_delete(local_48,CONCAT44(uStack_34,CONCAT13(uStack_35,CONCAT12(uStack_36,local_38))
                                         ) + 1);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(RStack_58.m_oss," }",2);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,&RStack_58);
  ReusableStringStream::~ReusableStringStream(&RStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }